

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O3

ostream * Imath_3_2::operator<<(ostream *s,Matrix22<float> *m)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  
  lVar5 = *(long *)s;
  poVar3 = s + *(long *)(lVar5 + -0x18) + 0x18;
  uVar1 = *(uint *)poVar3;
  iVar6 = 5;
  uVar4 = uVar1;
  if ((uVar1 & 4) == 0) {
    *(uint *)poVar3 = uVar1 | 0x100;
    poVar3 = s + *(long *)(lVar5 + -0x18) + 0x18;
    uVar4 = *(uint *)poVar3;
    iVar6 = 8;
  }
  *(uint *)poVar3 = uVar4 | 0x400;
  iVar2 = *(int *)(s + *(long *)(lVar5 + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>(s,"(",1);
  lVar5 = (long)(iVar6 + iVar2);
  *(long *)(s + *(long *)(*(long *)s + -0x18) + 0x10) = lVar5;
  poVar3 = std::ostream::_M_insert<double>((double)m->x[0][0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = std::ostream::_M_insert<double>((double)m->x[0][1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = std::ostream::_M_insert<double>((double)m->x[1][0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = lVar5;
  poVar3 = std::ostream::_M_insert<double>((double)m->x[1][1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
  *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) = uVar1;
  return s;
}

Assistant:

std::ostream&
operator<< (std::ostream& s, const Matrix22<T>& m)
{
    std::ios_base::fmtflags oldFlags = s.flags ();
    int                     width;

    if (s.flags () & std::ios_base::fixed)
    {
        s.setf (std::ios_base::showpoint);
        width = static_cast<int> (s.precision ()) + 5;
    }
    else
    {
        s.setf (std::ios_base::scientific);
        s.setf (std::ios_base::showpoint);
        width = static_cast<int> (s.precision ()) + 8;
    }

    s << "(" << std::setw (width) << m[0][0] << " " << std::setw (width)
      << m[0][1] << "\n"
      <<

        " " << std::setw (width) << m[1][0] << " " << std::setw (width)
      << m[1][1] << ")\n";

    s.flags (oldFlags);
    return s;
}